

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlValidateNCName(xmlChar *value,int space)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  byte *pbVar4;
  byte bVar5;
  xmlChar *cur;
  int l;
  undefined8 local_38;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  pbVar4 = value;
  if (space == 0) {
    bVar5 = *value;
  }
  else {
    while( true ) {
      bVar5 = *pbVar4;
      if ((0x20 < (ulong)bVar5) || ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) break;
      pbVar4 = pbVar4 + 1;
    }
  }
  if (((byte)(bVar5 + 0x9f) < 0x1a) || (bVar5 == 0x5f || (byte)(bVar5 + 0xbf) < 0x1a)) {
    pbVar4 = pbVar4 + 2;
    while (((bVar5 = pbVar4[-1], (byte)(bVar5 - 0x30) < 10 || ((byte)((bVar5 & 0xdf) + 0xbf) < 0x1a)
            ) || ((bVar5 - 0x2d < 0x33 &&
                  ((0x4000000000003U >> ((ulong)(bVar5 - 0x2d) & 0x3f) & 1) != 0))))) {
      pbVar4 = pbVar4 + 1;
    }
    if (space != 0) {
      while ((bVar5 < 0x21 && ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0))) {
        bVar5 = *pbVar4;
        pbVar4 = pbVar4 + 1;
      }
    }
    if (bVar5 == 0) {
      return 0;
    }
  }
  local_38 = in_RAX;
  uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
  if (space == 0) {
    if ((int)uVar1 < 0x100) {
LAB_00184eb0:
      if ((0x16 < uVar1 - 0xc0) &&
         ((((0x19 < (uVar1 & 0xffffffdf) - 0x41 && (uVar1 != 0x5f)) && ((int)uVar1 < 0xf8)) &&
          (0x1e < uVar1 - 0xd8)))) {
        return 1;
      }
      goto LAB_00184f3a;
    }
  }
  else {
    while ((int)uVar1 < 0x100) {
      if ((0x20 < uVar1) || ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) goto LAB_00184eb0;
      value = value + (int)local_38;
      uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
    }
  }
  iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
  if ((iVar2 == 0) &&
     ((uVar1 - 0x302a < 0xfffffff7 && uVar1 - 0x9fa6 < 0xffffae5a) && uVar1 != 0x3007)) {
    return 1;
  }
LAB_00184f3a:
  local_38 = CONCAT44(space,(int)local_38);
LAB_00184f4f:
  value = value + (int)local_38;
  uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
  if ((int)uVar1 < 0x100) {
    if ((((uVar1 - 0xc0 < 0x17) || ((uVar1 & 0xffffffdf) - 0x41 < 0x1a)) || (uVar1 - 0x30 < 10)) ||
       ((0xf7 < (int)uVar1 || (uVar1 - 0xd8 < 0x1f)))) goto LAB_00184f4f;
  }
  else {
    iVar2 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
    if (((iVar2 != 0) || ((uVar1 - 0x3021 < 9 || uVar1 - 0x4e00 < 0x51a6) || uVar1 == 0x3007)) ||
       (iVar2 = xmlCharInRange(uVar1,&xmlIsDigitGroup), iVar2 != 0)) goto LAB_00184f4f;
  }
  if ((0x32 < uVar1 - 0x2d) || ((0x4000000000003U >> ((ulong)(uVar1 - 0x2d) & 0x3f) & 1) == 0)) {
    if ((int)uVar1 < 0x100) {
      uVar3 = (uint)(uVar1 == 0xb7);
    }
    else {
      iVar2 = xmlCharInRange(uVar1,&xmlIsCombiningGroup);
      if (iVar2 != 0) goto LAB_00184f4f;
      uVar3 = xmlCharInRange(uVar1,&xmlIsExtenderGroup);
    }
    if (uVar3 == 0) {
      if (local_38._4_4_ != 0) {
        while ((((int)uVar1 < 0x100 && (uVar1 < 0x21)) &&
               ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) != 0))) {
          value = value + (int)local_38;
          uVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
        }
      }
      return (uint)(uVar1 != 0);
    }
  }
  goto LAB_00184f4f;
}

Assistant:

int
xmlValidateNCName(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);

    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) || ((*cur >= 'A') && (*cur <= 'Z')) ||
	(*cur == '_'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.'))
	cur++;
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if ((!IS_LETTER(c)) && (c != '_'))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) ||
	   IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);

    return(0);
}